

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O1

uint16_t __thiscall World::first_empty_game_string_id(World *this,uint16_t initial_index)

{
  pointer pbVar1;
  long lVar2;
  uint16_t uVar3;
  ulong uVar4;
  ulong uVar5;
  long *plVar6;
  undefined6 in_register_00000032;
  ulong uVar7;
  bool bVar8;
  
  uVar7 = CONCAT62(in_register_00000032,initial_index);
  uVar5 = uVar7 & 0xffffffff;
  pbVar1 = (this->_game_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->_game_strings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
  bVar8 = uVar5 < uVar4;
  if ((uVar5 < uVar4) &&
     (*(long *)((long)&pbVar1->_M_string_length + (ulong)(uint)((int)uVar7 << 5)) != 0)) {
    plVar6 = (long *)((long)&pbVar1[1]._M_string_length + (ulong)(uint)((int)uVar7 << 5));
    uVar7 = 0;
    do {
      if ((uVar5 - uVar4) + 1 == uVar7) {
        bVar8 = false;
        goto LAB_001d74e0;
      }
      uVar7 = uVar7 - 1;
      lVar2 = *plVar6;
      plVar6 = plVar6 + 4;
    } while (lVar2 != 0);
    bVar8 = uVar5 - uVar7 < uVar4;
    uVar7 = uVar5 - uVar7 & 0xffffffff;
  }
LAB_001d74e0:
  uVar3 = (uint16_t)uVar4;
  if (bVar8) {
    uVar3 = (uint16_t)uVar7;
  }
  return uVar3;
}

Assistant:

uint16_t World::first_empty_game_string_id(uint16_t initial_index) const
{
    for(size_t i=initial_index ; i<_game_strings.size() ; ++i)
        if(_game_strings[i].empty())
            return (uint16_t) i;
    return _game_strings.size();
}